

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O3

pint p_test_case_gost3411_94_test(void)

{
  int iVar1;
  long lVar2;
  char *__s1;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  general_hash_test(P_CRYPTO_HASH_TYPE_GOST,0x20,"This is message, length=32 bytes",
                    "Suppose the original message has length = 50 bytes",&DAT_001044a0,&DAT_001044c0
                    ,&DAT_001044e0,
                    "2cefc2f7b7bdc514e18ea57fa74ff357e7fa17d652c75f69cb1be7893ede48eb",
                    "c3730c5cbccacf915ac292676f21e8bd4ef75331d9405e5f1a61dc3130a65011",
                    "8693287aa62f9478f7cb312ec0866b6c4e4a0f11160441e8f4ffcd2715dd554f",
                    "3738fb45a7f0de6a5447163c0b441ead7a23e48e7af553829dc4300a99f86343");
  lVar2 = p_crypto_hash_new(10);
  if (lVar2 != 0) {
    p_crypto_hash_update(lVar2,"message digest",0xe);
    p_crypto_hash_update(lVar2,"message digest",0xe);
    p_crypto_hash_update(lVar2,"message digest",0xe);
    p_crypto_hash_update(lVar2,"message digest",0xe);
    __s1 = (char *)p_crypto_hash_get_string(lVar2);
    iVar1 = strcmp(__s1,"9c7b5288c8b3343b29e8ee4a5579593bd90131db7f6fed9b13af4399698b5d29");
    if (iVar1 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
             ,0x27c);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    p_free(__s1);
    p_crypto_hash_reset(lVar2);
    p_crypto_hash_free(lVar2);
    p_libsys_shutdown();
    return -(uint)(p_test_module_fail_counter != 0);
  }
  printf("%s:%d: required check failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
         ,0x273);
  exit(-1);
}

Assistant:

P_TEST_CASE_BEGIN (gost3411_94_test)
{
	PCryptoHash	*gost3411_94_hash;
	pchar		*hash_str;
	const puchar	hash_etalon_1[] = { 44, 239, 194, 247, 183, 189, 197,  20,
					   225, 142, 165, 127, 167,  79, 243,  87,
					   231, 250,  23, 214,  82, 199,  95, 105,
					   203,  27, 231, 137,  62, 222,  72, 235};
	const puchar	hash_etalon_2[] = {195, 115,  12,  92, 188, 202, 207, 145,
					    90, 194, 146, 103, 111,  33, 232, 189,
					    78, 247,  83,  49, 217,  64,  94,  95,
					    26,  97, 220,  49,  48, 166,  80,  17};
	const puchar	hash_etalon_3[] = {134, 147,  40, 122, 166,  47, 148, 120,
					   247, 203,  49,  46, 192, 134, 107, 108,
					    78,  74,  15,  17,  22,   4,  65, 232,
					   244, 255, 205,  39,  21, 221,  85,  79};

	p_libsys_init ();

	general_hash_test (P_CRYPTO_HASH_TYPE_GOST,
			   32,
			   "This is message, length=32 bytes",
			   "Suppose the original message has length = 50 bytes",
			   hash_etalon_1,
			   hash_etalon_2,
			   hash_etalon_3,
			   "2cefc2f7b7bdc514e18ea57fa74ff357e7fa17d652c75f69cb1be7893ede48eb",
			   "c3730c5cbccacf915ac292676f21e8bd4ef75331d9405e5f1a61dc3130a65011",
			   "8693287aa62f9478f7cb312ec0866b6c4e4a0f11160441e8f4ffcd2715dd554f",
			   "3738fb45a7f0de6a5447163c0b441ead7a23e48e7af553829dc4300a99f86343");

	gost3411_94_hash = p_crypto_hash_new (P_CRYPTO_HASH_TYPE_GOST);

	P_TEST_REQUIRE (gost3411_94_hash != NULL);

	/* Repeat test */
	p_crypto_hash_update (gost3411_94_hash, (const puchar *) "message digest", 14);
	p_crypto_hash_update (gost3411_94_hash, (const puchar *) "message digest", 14);
	p_crypto_hash_update (gost3411_94_hash, (const puchar *) "message digest", 14);
	p_crypto_hash_update (gost3411_94_hash, (const puchar *) "message digest", 14);

	hash_str = p_crypto_hash_get_string (gost3411_94_hash);
	P_TEST_CHECK (strcmp (hash_str, "9c7b5288c8b3343b29e8ee4a5579593bd90131db7f6fed9b13af4399698b5d29") == 0);
	p_free (hash_str);

	p_crypto_hash_reset (gost3411_94_hash);
	p_crypto_hash_free (gost3411_94_hash);

	p_libsys_shutdown ();
}